

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::InputFloatN(char *label,float *v,int components,int decimal_precision,
                       ImGuiInputTextFlags extra_flags)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  char *text_end;
  ulong uVar8;
  uint uVar9;
  float w_full;
  float fVar10;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->Accessed = true;
  if (pIVar2->SkipItems == false) {
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components,w_full);
    if (components < 1) {
      bVar7 = false;
    }
    else {
      uVar8 = 0;
      bVar7 = false;
      do {
        PushID((int)uVar8);
        bVar6 = InputFloat("##v",v,0.0,0.0,decimal_precision,extra_flags);
        pIVar5 = GImGui;
        fVar10 = (pIVar4->Style).ItemInnerSpacing.x;
        pIVar3 = GImGui->CurrentWindow;
        pIVar3->Accessed = true;
        if (pIVar3->SkipItems == false) {
          if (fVar10 < 0.0) {
            fVar10 = (pIVar5->Style).ItemSpacing.x;
          }
          (pIVar3->DC).CursorPos.x = fVar10 + (pIVar3->DC).CursorPosPrevLine.x;
          (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
          (pIVar3->DC).CurrentLineHeight = (pIVar3->DC).PrevLineHeight;
          (pIVar3->DC).CurrentLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
        }
        bVar7 = (bool)(bVar7 | bVar6);
        PopID();
        PopItemWidth();
        uVar8 = uVar8 + 1;
        v = v + 1;
      } while ((uint)components != uVar8);
    }
    PopID();
    fVar10 = (pIVar2->DC).CurrentLineTextBaseOffset;
    fVar1 = (pIVar4->Style).FramePadding.y;
    uVar9 = -(uint)(fVar1 <= fVar10);
    (pIVar2->DC).CurrentLineTextBaseOffset = (float)(~uVar9 & (uint)fVar1 | (uint)fVar10 & uVar9);
    text_end = label;
    if (label != (char *)0xffffffffffffffff) {
      do {
        if (*text_end == '#') {
          if (text_end[1] == '#') goto LAB_0016ff19;
        }
        else if (*text_end == '\0') goto LAB_0016ff19;
        text_end = text_end + 1;
      } while (text_end != (char *)0xffffffffffffffff);
    }
    text_end = (char *)0xffffffffffffffff;
LAB_0016ff19:
    TextUnformatted(label,text_end);
    EndGroup();
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool ImGui::InputFloatN(const char* label, float* v, int components, int decimal_precision, ImGuiInputTextFlags extra_flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components);
    for (int i = 0; i < components; i++)
    {
        PushID(i);
        value_changed |= InputFloat("##v", &v[i], 0, 0, decimal_precision, extra_flags);
        SameLine(0, g.Style.ItemInnerSpacing.x);
        PopID();
        PopItemWidth();
    }
    PopID();

    window->DC.CurrentLineTextBaseOffset = ImMax(window->DC.CurrentLineTextBaseOffset, g.Style.FramePadding.y);
    TextUnformatted(label, FindRenderedTextEnd(label));
    EndGroup();

    return value_changed;
}